

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

int getnum_aux(lua_State *L,lua_State *L1,char **pc)

{
  byte *pbVar1;
  byte bVar2;
  lua_Integer lVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  
  skip(pc);
  pbVar1 = (byte *)*pc;
  bVar2 = *pbVar1;
  if (bVar2 == 0x2a) {
    iVar6 = lua_gettop(L1);
    *pc = *pc + 1;
  }
  else {
    if (bVar2 == 0x2d) {
      pbVar4 = pbVar1 + 1;
      *pc = (char *)pbVar4;
      bVar2 = pbVar1[1];
      iVar5 = -1;
    }
    else {
      if (bVar2 == 0x2e) {
        lVar3 = lua_tointegerx(L1,-1,(int *)0x0);
        lua_settop(L1,-2);
        *pc = *pc + 1;
        return (int)lVar3;
      }
      iVar5 = 1;
      pbVar4 = pbVar1;
    }
    if ((""[(ulong)bVar2 + 1] & 2) == 0) {
      luaL_error(L,"number expected (%s)");
      pbVar4 = (byte *)*pc;
    }
    iVar6 = 0;
    while ((""[(ulong)*pbVar4 + 1] & 2) != 0) {
      *pc = (char *)(pbVar4 + 1);
      iVar6 = iVar6 * 10 + -0x30 + (int)(char)*pbVar4;
      pbVar4 = pbVar4 + 1;
    }
    iVar6 = iVar6 * iVar5;
  }
  return iVar6;
}

Assistant:

static int getnum_aux (lua_State *L, lua_State *L1, const char **pc) {
  int res = 0;
  int sig = 1;
  skip(pc);
  if (**pc == '.') {
    res = cast_int(lua_tointeger(L1, -1));
    lua_pop(L1, 1);
    (*pc)++;
    return res;
  }
  else if (**pc == '*') {
    res = lua_gettop(L1);
    (*pc)++;
    return res;
  }
  else if (**pc == '-') {
    sig = -1;
    (*pc)++;
  }
  if (!lisdigit(cast_uchar(**pc)))
    luaL_error(L, "number expected (%s)", *pc);
  while (lisdigit(cast_uchar(**pc))) res = res*10 + (*(*pc)++) - '0';
  return sig*res;
}